

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall cmMakefileTargetGenerator::WriteTargetBuildRules(cmMakefileTargetGenerator *this)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  cmGeneratorTarget *pcVar2;
  cmMakefile *pcVar3;
  pointer pbVar4;
  cmOSXBundleGenerator *pcVar5;
  MacOSXContentGeneratorType *pMVar6;
  pointer __n1;
  cmLocalUnixMakefileGenerator3 *pcVar7;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile_00;
  pointer ppcVar8;
  pointer ppcVar9;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar10;
  pointer ppcVar11;
  undefined8 uVar12;
  bool bVar13;
  int iVar14;
  cmValue cVar15;
  string *psVar16;
  _Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
  *this_00;
  cmCustomCommand *cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar17;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar18;
  cmFileSet *this_01;
  mapped_type *pmVar19;
  _Rb_tree_node_base *p_Var20;
  iterator iVar21;
  string *psVar22;
  cmMakefileTargetGenerator *pcVar23;
  cmMakefileTargetGenerator *pcVar24;
  pointer ppcVar25;
  pointer pbVar26;
  _Base_ptr p_Var27;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *cge;
  string *ispcObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  pair<std::_Rb_tree_iterator<const_cmSourceFile_*>,_bool> pVar28;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string_view value;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  file_set_map;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  requiredLangs;
  cmList files;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> externalObjects;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  anon_class_8_1_8991fb9c evaluatedFiles;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> extraSources;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> headerSources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ispcAdditionalObjs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  undefined8 in_stack_fffffffffffffc10;
  cmMakefileTargetGenerator *this_02;
  _Base_ptr p_Var29;
  cmSourceFile *pcVar30;
  cmTarget *this_03;
  cmSourceFile *local_3d8;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_3c8;
  undefined1 local_3a8 [16];
  string local_398;
  undefined1 local_378 [16];
  undefined1 local_368 [32];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  _Alloc_hider local_318;
  char *local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  pointer local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_2e0;
  _Alloc_hider local_2d8;
  _Base_ptr local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  _Alloc_hider local_2b8;
  _Base_ptr local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8 [12];
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_1e8;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_1c8;
  undefined1 local_1b0 [32];
  undefined1 local_190 [16];
  undefined1 auStack_180 [32];
  _Base_ptr p_Stack_160;
  size_t local_158;
  string *local_150;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_148;
  bool local_128;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_120;
  bool local_100;
  size_t local_f8;
  undefined1 auStack_f0 [8];
  code *local_e8;
  _Base_ptr p_Stack_e0;
  _Base_ptr local_d8;
  _Base_ptr p_Stack_d0;
  code *local_c8;
  __buckets_ptr pp_Stack_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  string local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  local_68;
  string local_50;
  
  pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_348,this);
  cmGeneratorTarget::CheckCxxModuleStatus(pcVar2,(string *)local_348);
  if ((undefined1 *)local_348._0_8_ != local_338) {
    operator_delete((void *)local_348._0_8_,local_338._0_8_ + 1);
  }
  pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
  local_348._0_8_ = local_338;
  local_190._0_8_ = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_348,"ADDITIONAL_MAKE_CLEAN_FILES","");
  cVar15 = cmMakefile::GetProperty(pcVar3,(string *)local_348);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338) {
    operator_delete((void *)local_348._0_8_,local_338._0_8_ + 1);
  }
  pcVar23 = this;
  if (cVar15.Value != (string *)0x0) {
    WriteTargetBuildRules::anon_class_8_1_8991fb9c::operator()
              ((cmList *)local_348,(anon_class_8_1_8991fb9c *)local_190,cVar15.Value);
    uVar12 = local_348._8_8_;
    psVar1 = &this->CleanFiles;
    local_3a8._0_8_ = psVar1;
    if (local_348._0_8_ != local_348._8_8_) {
      psVar10 = &pcVar23->CleanFiles;
      __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348._0_8_;
      do {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_unique_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)psVar1,(const_iterator)&(psVar10->_M_t)._M_impl.super__Rb_tree_header,__v,
                   (_Alloc_node *)local_3a8);
        __v = __v + 1;
      } while (__v != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar12);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_348);
  }
  pcVar2 = (pcVar23->super_cmCommonTargetGenerator).GeneratorTarget;
  local_348._0_8_ = local_338;
  pcVar24 = pcVar23;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"ADDITIONAL_CLEAN_FILES","");
  cVar15 = cmGeneratorTarget::GetProperty(pcVar2,(string *)local_348);
  if ((undefined1 *)local_348._0_8_ != local_338) {
    operator_delete((void *)local_348._0_8_,local_338._0_8_ + 1);
  }
  if (cVar15.Value != (string *)0x0) {
    WriteTargetBuildRules::anon_class_8_1_8991fb9c::operator()
              ((cmList *)local_3a8,(anon_class_8_1_8991fb9c *)local_190,cVar15.Value);
    psVar16 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                        ((cmLocalGenerator *)pcVar23->LocalGenerator);
    pcVar23 = pcVar24;
    if ((string *)local_3a8._0_8_ != (string *)CONCAT44(local_3a8._12_4_,local_3a8._8_4_)) {
      psVar22 = (string *)local_3a8._0_8_;
      do {
        cmsys::SystemTools::CollapseFullPath((string *)local_348,psVar22,psVar16);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&pcVar24->CleanFiles,(string *)local_348);
        if ((undefined1 *)local_348._0_8_ != local_338) {
          operator_delete((void *)local_348._0_8_,local_338._0_8_ + 1);
        }
        psVar22 = psVar22 + 1;
      } while (psVar22 != (string *)CONCAT44(local_3a8._12_4_,local_3a8._8_4_));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_3a8);
    pcVar24 = pcVar23;
  }
  pcVar2 = (pcVar23->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_348,pcVar23);
  cmGeneratorTarget::GetGeneratedISPCObjects(&local_b8,pcVar2,(string *)local_348);
  if ((undefined1 *)local_348._0_8_ != local_338) {
    operator_delete((void *)local_348._0_8_,local_338._0_8_ + 1);
  }
  if (local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar1 = &pcVar24->CleanFiles;
    pbVar26 = local_b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      cmOutputConverter::MaybeRelativeToCurBinDir
                ((string *)local_348,(cmOutputConverter *)pcVar24->LocalGenerator,pbVar26);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)psVar1,(string *)local_348);
      if ((undefined1 *)local_348._0_8_ != local_338) {
        operator_delete((void *)local_348._0_8_,local_338._0_8_ + 1);
      }
      pbVar26 = pbVar26 + 1;
    } while (pbVar26 !=
             local_b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pcVar3 = (pcVar24->super_cmCommonTargetGenerator).Makefile;
  local_348._0_8_ = local_338;
  pcVar23 = pcVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"CLEAN_NO_CUSTOM","");
  cVar15 = cmMakefile::GetProperty(pcVar3,(string *)local_348);
  if (cVar15.Value == (string *)0x0) {
    bVar13 = true;
  }
  else {
    value._M_str = ((cVar15.Value)->_M_dataplus)._M_p;
    value._M_len = (cVar15.Value)->_M_string_length;
    bVar13 = cmValue::IsOff(value);
  }
  if ((cmGeneratorTarget *)local_348._0_8_ != (cmGeneratorTarget *)local_338) {
    operator_delete((void *)local_348._0_8_,local_338._0_8_ + 1);
  }
  local_1c8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = (pcVar24->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_348,pcVar24);
  cmGeneratorTarget::GetCustomCommands(pcVar2,&local_1c8,(string *)local_348);
  if ((cmGeneratorTarget *)local_348._0_8_ != (cmGeneratorTarget *)local_338) {
    operator_delete((void *)local_348._0_8_,local_338._0_8_ + 1);
  }
  pcVar24 = pcVar23;
  if (local_1c8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_1c8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    p_Var27 = (_Base_ptr)
              local_1c8.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    p_Var29 = (_Base_ptr)
              local_1c8.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    do {
      local_378._0_8_ = *(undefined8 *)p_Var27;
      this_02 = pcVar24;
      if ((code)pcVar24->CMP0113New == (code)0x1) {
        local_348._0_8_ = (pcVar24->super_cmCommonTargetGenerator).GeneratorTarget;
        this_00 = (_Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
                   *)std::
                     map<const_cmGeneratorTarget_*,_std::set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<const_cmSourceFile_*,_std::less<const_cmSourceFile_*>,_std::allocator<const_cmSourceFile_*>_>_>_>_>
                     ::operator[](&pcVar24->LocalGenerator->CommandsVisited,(key_type *)local_348);
        pVar28 = std::
                 _Rb_tree<cmSourceFile_const*,cmSourceFile_const*,std::_Identity<cmSourceFile_const*>,std::less<cmSourceFile_const*>,std::allocator<cmSourceFile_const*>>
                 ::_M_insert_unique<cmSourceFile_const*const&>(this_00,(cmSourceFile **)local_378);
        this_02 = pcVar24;
        if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
        goto LAB_005f20c4;
      }
      else {
LAB_005f20c4:
        cc = cmSourceFile::GetCustomCommand((cmSourceFile *)local_378._0_8_);
        GetConfigName_abi_cxx11_(&local_a0,pcVar23);
        local_100 = false;
        local_d8 = (_Base_ptr)0x0;
        p_Stack_d0 = (_Base_ptr)0x0;
        local_c8 = (code *)0x0;
        pp_Stack_c0 = (__buckets_ptr)0x0;
        computeInternalDepfile.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffc10;
        computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object = &local_d8;
        computeInternalDepfile.super__Function_base._M_manager = (_Manager_type)this_02;
        computeInternalDepfile._M_invoker = (_Invoker_type)p_Var29;
        cmCustomCommandGenerator::cmCustomCommandGenerator
                  ((cmCustomCommandGenerator *)local_348,cc,&local_a0,
                   (cmLocalGenerator *)pcVar23->LocalGenerator,true,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_120,computeInternalDepfile);
        if (local_c8 != (code *)0x0) {
          (*local_c8)(&local_d8,&local_d8,3);
        }
        pcVar24 = this_02;
        if ((local_100 == true) &&
           (local_100 = false,
           local_120._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_120._M_value + 0x10)))
        {
          operator_delete((void *)local_120._M_value._M_dataplus._M_p,(ulong)(local_120._16_8_ + 1))
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,
                          (ulong)(local_a0.field_2._M_allocated_capacity + 1));
        }
        GenerateCustomRuleFile(this_02,(cmCustomCommandGenerator *)local_348);
        if (bVar13 != false) {
          pvVar17 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                              ((cmCustomCommandGenerator *)local_348);
          pbVar4 = (pvVar17->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar26 = (pvVar17->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start; pbVar26 != pbVar4;
              pbVar26 = pbVar26 + 1) {
            cmOutputConverter::MaybeRelativeToCurBinDir
                      ((string *)local_3a8,(cmOutputConverter *)pcVar24->LocalGenerator,pbVar26);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&pcVar23->CleanFiles,(string *)local_3a8);
            if ((string *)local_3a8._0_8_ != &local_398) {
              operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._M_dataplus._M_p + 1));
            }
          }
          pvVar17 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                              ((cmCustomCommandGenerator *)local_348);
          pbVar4 = (pvVar17->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar26 = (pvVar17->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start; pbVar26 != pbVar4;
              pbVar26 = pbVar26 + 1) {
            cmOutputConverter::MaybeRelativeToCurBinDir
                      ((string *)local_3a8,(cmOutputConverter *)pcVar24->LocalGenerator,pbVar26);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&pcVar23->CleanFiles,(string *)local_3a8);
            if ((string *)local_3a8._0_8_ != &local_398) {
              operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._M_dataplus._M_p + 1));
            }
          }
        }
        cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_348);
      }
      p_Var27 = (_Base_ptr)&p_Var27->_M_parent;
    } while (p_Var27 != p_Var29);
  }
  pcVar23 = pcVar24;
  if (bVar13 != false) {
    pvVar18 = cmGeneratorTarget::GetPreBuildCommands
                        ((pcVar24->super_cmCommonTargetGenerator).GeneratorTarget);
    std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector
              ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)local_378,pvVar18);
    pvVar18 = cmGeneratorTarget::GetPreLinkCommands
                        ((pcVar24->super_cmCommonTargetGenerator).GeneratorTarget);
    std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cmCustomCommand_const*,std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>>>
              ((vector<cmCustomCommand,std::allocator<cmCustomCommand>> *)local_378,
               CONCAT44(local_378._12_4_,local_378._8_4_),
               (pvVar18->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
               _M_impl.super__Vector_impl_data._M_start,
               (pvVar18->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
               _M_impl.super__Vector_impl_data._M_finish);
    pvVar18 = cmGeneratorTarget::GetPostBuildCommands
                        ((pcVar24->super_cmCommonTargetGenerator).GeneratorTarget);
    std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cmCustomCommand_const*,std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>>>
              ((vector<cmCustomCommand,std::allocator<cmCustomCommand>> *)local_378,
               CONCAT44(local_378._12_4_,local_378._8_4_),
               (pvVar18->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
               _M_impl.super__Vector_impl_data._M_start,
               (pvVar18->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
               _M_impl.super__Vector_impl_data._M_finish);
    pcVar30 = (cmSourceFile *)CONCAT44(local_378._12_4_,local_378._8_4_);
    local_3d8 = (cmSourceFile *)local_378._0_8_;
    if ((cmSourceFile *)local_378._0_8_ != pcVar30) {
      psVar1 = &pcVar24->CleanFiles;
      do {
        GetConfigName_abi_cxx11_(&local_50,pcVar24);
        local_128 = false;
        local_f8 = 0;
        auStack_f0 = (undefined1  [8])0x0;
        local_e8 = (code *)0x0;
        p_Stack_e0 = (_Base_ptr)0x0;
        computeInternalDepfile_00.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffc10;
        computeInternalDepfile_00.super__Function_base._M_functor._M_unused._M_object = &local_f8;
        computeInternalDepfile_00.super__Function_base._M_manager = (_Manager_type)pcVar23;
        computeInternalDepfile_00._M_invoker = (_Invoker_type)pcVar30;
        cmCustomCommandGenerator::cmCustomCommandGenerator
                  ((cmCustomCommandGenerator *)local_348,(cmCustomCommand *)local_3d8,&local_50,
                   (cmLocalGenerator *)pcVar24->LocalGenerator,true,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_148,computeInternalDepfile_00);
        pcVar24 = pcVar23;
        if (local_e8 != (code *)0x0) {
          (*local_e8)(&local_f8,&local_f8,3);
          pcVar24 = pcVar23;
        }
        if ((local_128 == true) &&
           (local_128 = false,
           local_148._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_148._M_value + 0x10)))
        {
          operator_delete((void *)local_148._M_value._M_dataplus._M_p,(ulong)(local_148._16_8_ + 1))
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._0_8_ + 1);
        }
        pvVar17 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                            ((cmCustomCommandGenerator *)local_348);
        pbVar4 = (pvVar17->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar26 = (pvVar17->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; pbVar26 != pbVar4;
            pbVar26 = pbVar26 + 1) {
          cmOutputConverter::MaybeRelativeToCurBinDir
                    ((string *)local_3a8,(cmOutputConverter *)pcVar24->LocalGenerator,pbVar26);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)psVar1,(string *)local_3a8);
          if ((string *)local_3a8._0_8_ != &local_398) {
            operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._M_dataplus._M_p + 1));
          }
        }
        cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_348);
        local_3d8 = (cmSourceFile *)&local_3d8->CompileDefinitions;
        pcVar23 = pcVar24;
      } while (local_3d8 != pcVar30);
    }
    std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::~vector
              ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)local_378);
  }
  auStack_180._24_8_ = (_Base_ptr)0x0;
  p_Stack_160 = (_Base_ptr)0x0;
  local_158 = 0;
  pcVar2 = (pcVar24->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_348,pcVar24);
  cmGeneratorTarget::GetHeaderSources
            (pcVar2,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                    (auStack_180 + 0x18),(string *)local_348);
  if ((cmGeneratorTarget *)local_348._0_8_ != (cmGeneratorTarget *)local_338) {
    operator_delete((void *)local_348._0_8_,local_338._0_8_ + 1);
  }
  pcVar5 = (pcVar24->OSXBundleGenerator)._M_t.
           super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
           .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
  pMVar6 = (pcVar24->MacOSXContentGenerator)._M_t.
           super___uniq_ptr_impl<cmMakefileTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
           .super__Head_base<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_false>.
           _M_head_impl;
  GetConfigName_abi_cxx11_((string *)local_348,pcVar24);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (pcVar5,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                    (auStack_180 + 0x18),&pMVar6->super_MacOSXContentGeneratorType,
             (string *)local_348);
  if ((cmGeneratorTarget *)local_348._0_8_ != (cmGeneratorTarget *)local_338) {
    operator_delete((void *)local_348._0_8_,local_338._0_8_ + 1);
  }
  local_190._8_8_ = (void *)0x0;
  auStack_180._0_8_ = 0;
  auStack_180._8_8_ = 0;
  pcVar2 = (pcVar24->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_348,pcVar24);
  cmGeneratorTarget::GetExtraSources
            (pcVar2,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                    (local_190 + 8),(string *)local_348);
  if ((cmGeneratorTarget *)local_348._0_8_ != (cmGeneratorTarget *)local_338) {
    operator_delete((void *)local_348._0_8_,local_338._0_8_ + 1);
  }
  pcVar5 = (pcVar24->OSXBundleGenerator)._M_t.
           super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
           .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
  pMVar6 = (pcVar24->MacOSXContentGenerator)._M_t.
           super___uniq_ptr_impl<cmMakefileTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
           .super__Head_base<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_false>.
           _M_head_impl;
  GetConfigName_abi_cxx11_((string *)local_348,pcVar24);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (pcVar5,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                    (local_190 + 8),&pMVar6->super_MacOSXContentGeneratorType,(string *)local_348);
  if ((cmGeneratorTarget *)local_348._0_8_ != (cmGeneratorTarget *)local_338) {
    operator_delete((void *)local_348._0_8_,local_338._0_8_ + 1);
  }
  pcVar3 = (pcVar24->super_cmCommonTargetGenerator).Makefile;
  local_348._0_8_ = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"CMAKE_PCH_EXTENSION","");
  cVar15 = cmMakefile::GetDefinition(pcVar3,(string *)local_348);
  if ((undefined1 *)local_348._0_8_ != local_338) {
    operator_delete((void *)local_348._0_8_,local_338._0_8_ + 1);
  }
  local_1e8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = (pcVar24->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_348,pcVar24);
  cmGeneratorTarget::GetExternalObjects(pcVar2,&local_1e8,(string *)local_348);
  if ((undefined1 *)local_348._0_8_ != local_338) {
    operator_delete((void *)local_348._0_8_,local_338._0_8_ + 1);
  }
  ppcVar8 = local_1e8.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (local_1e8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_1e8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    p_Var27 = (_Base_ptr)
              local_1e8.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      psVar16 = cmSourceFile::GetFullPath_abi_cxx11_(*(cmSourceFile **)p_Var27);
      local_348._8_8_ = (psVar16->_M_dataplus)._M_p;
      local_348._0_8_ = psVar16->_M_string_length;
      if (cVar15.Value == (string *)0x0) {
LAB_005f2763:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pcVar24->ExternalObjects,psVar16);
      }
      else {
        __n1 = (pointer)(cVar15.Value)->_M_string_length;
        if (((ulong)local_348._0_8_ < __n1) ||
           (__str._M_str = ((cVar15.Value)->_M_dataplus)._M_p, __str._M_len = (size_t)__n1,
           iVar14 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_348,
                               local_348._0_8_ - (long)__n1,(size_type)__n1,__str), iVar14 != 0))
        goto LAB_005f2763;
      }
      p_Var27 = (_Base_ptr)&p_Var27->_M_parent;
    } while (p_Var27 != (_Base_ptr)ppcVar8);
  }
  local_398._M_string_length = (size_type)(local_3a8 + 8);
  local_3a8._8_4_ = _S_red;
  local_398._M_dataplus._M_p = (pointer)0x0;
  local_398.field_2._8_8_ = 0;
  this_03 = ((pcVar24->super_cmCommonTargetGenerator).GeneratorTarget)->Target;
  local_398.field_2._M_allocated_capacity = local_398._M_string_length;
  cmTarget::GetAllFileSetNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1b0,this_03);
  local_150 = (string *)local_1b0._8_8_;
  if (local_1b0._0_8_ != local_1b0._8_8_) {
    psVar16 = (string *)local_1b0._0_8_;
    do {
      this_01 = cmTarget::GetFileSet(this_03,psVar16);
      if (this_01 == (cmFileSet *)0x0) {
        pcVar3 = (pcVar24->super_cmCommonTargetGenerator).Makefile;
        psVar22 = cmTarget::GetName_abi_cxx11_(this_03);
        local_348._0_8_ = (pointer)0x8;
        local_348._8_8_ = (long)"\nTarget \"" + 1;
        local_338._0_8_ = 0;
        local_328._M_allocated_capacity = (size_type)(psVar22->_M_dataplus)._M_p;
        local_338._8_8_ = psVar22->_M_string_length;
        local_328._8_8_ = 0;
        local_318._M_p = (pointer)0x1f;
        local_310 = "\" is tracked to have file set \"";
        local_308._M_allocated_capacity = 0;
        local_2f8 = (psVar16->_M_dataplus)._M_p;
        local_308._8_8_ = psVar16->_M_string_length;
        local_2f0._M_allocated_capacity = 0;
        local_2f0._8_8_ = (_Base_ptr)0x18;
        local_2e0._M_head_impl = (cmCustomCommand *)0x8e7368;
        local_2d8._M_p = (pointer)0x0;
        views._M_len = 5;
        views._M_array = (iterator)local_348;
        cmCatViews((string *)local_378,views);
        cmMakefile::IssueMessage(pcVar3,INTERNAL_ERROR,(string *)local_378);
        if ((cmSourceFile *)local_378._0_8_ != (cmSourceFile *)local_368) {
          operator_delete((void *)local_378._0_8_,(ulong)(local_368._0_8_ + 1));
        }
      }
      else {
        cmFileSet::CompileFileEntries
                  ((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    *)&local_3c8,this_01);
        cmFileSet::CompileDirectoryEntries(&local_68,this_01);
        pcVar7 = pcVar24->LocalGenerator;
        GetConfigName_abi_cxx11_((string *)local_348,pcVar24);
        cmFileSet::EvaluateDirectoryEntries
                  (&local_80,this_01,&local_68,(cmLocalGenerator *)pcVar7,(string *)local_348,
                   (pcVar24->super_cmCommonTargetGenerator).GeneratorTarget,
                   (cmGeneratorExpressionDAGChecker *)0x0);
        if ((undefined1 *)local_348._0_8_ != local_338) {
          operator_delete((void *)local_348._0_8_,local_338._0_8_ + 1);
        }
        ppcVar8 = local_3c8.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        local_348._8_8_ = local_348._8_8_ & 0xffffffff00000000;
        local_338._0_8_ = 0;
        local_338._8_8_ = local_348 + 8;
        local_328._8_8_ = 0;
        local_328._M_allocated_capacity = local_338._8_8_;
        pcVar24 = pcVar23;
        for (cge = (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                    *)local_3c8.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            cge != (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                    *)ppcVar8; cge = cge + 1) {
          pcVar7 = pcVar24->LocalGenerator;
          pcVar23 = pcVar24;
          GetConfigName_abi_cxx11_((string *)local_378,pcVar24);
          cmFileSet::EvaluateFileEntry
                    (this_01,&local_80,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      *)local_348,cge,(cmLocalGenerator *)pcVar7,(string *)local_378,
                     (pcVar24->super_cmCommonTargetGenerator).GeneratorTarget,
                     (cmGeneratorExpressionDAGChecker *)0x0);
          if ((cmSourceFile *)local_378._0_8_ != (cmSourceFile *)local_368) {
            operator_delete((void *)local_378._0_8_,(ulong)(local_368._0_8_ + 1));
          }
          pcVar24 = pcVar23;
        }
        for (p_Var20 = (_Rb_tree_node_base *)local_338._8_8_;
            p_Var20 != (_Rb_tree_node_base *)(local_348 + 8);
            p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20)) {
          p_Var29 = p_Var20[2]._M_parent;
          for (p_Var27 = *(_Base_ptr *)(p_Var20 + 2); p_Var27 != p_Var29; p_Var27 = p_Var27 + 1) {
            pmVar19 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)local_3a8,(key_type *)p_Var27);
            std::__cxx11::string::_M_assign((string *)pmVar19);
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)local_348);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_80);
        std::
        vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
        ::~vector(&local_68);
        std::
        vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
        ::~vector((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                   *)&local_3c8);
        pcVar23 = pcVar24;
      }
      psVar16 = psVar16 + 1;
    } while (psVar16 != local_150);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1b0);
  local_3c8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = (pcVar24->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_348,pcVar24);
  cmGeneratorTarget::GetObjectSources(pcVar2,&local_3c8,(string *)local_348);
  if ((undefined1 *)local_348._0_8_ != local_338) {
    operator_delete((void *)local_348._0_8_,local_338._0_8_ + 1);
  }
  local_368._8_8_ = local_378 + 8;
  local_378._8_4_ = _S_red;
  local_368._0_8_ = (pointer)0x0;
  local_368._24_8_ = 0;
  local_368._16_8_ = local_368._8_8_;
  bVar13 = cmCommonTargetGenerator::HaveRequiredLanguages
                     (&pcVar24->super_cmCommonTargetGenerator,&local_3c8,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_378);
  ppcVar11 = local_3c8.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  ppcVar25 = local_3c8.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  ppcVar8 = local_3c8.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar9 = local_3c8.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (bVar13) {
    for (; ppcVar8 = local_3c8.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
        ppcVar9 = local_3c8.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish, ppcVar25 != ppcVar11;
        ppcVar25 = ppcVar25 + 1) {
      WriteObjectRuleFiles(pcVar23,*ppcVar25);
    }
  }
  for (; ppcVar11 = local_3c8.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish,
      ppcVar8 !=
      local_3c8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppcVar8 = ppcVar8 + 1) {
    pcVar30 = *ppcVar8;
    local_3c8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppcVar9;
    psVar16 = cmSourceFile::GetFullPath_abi_cxx11_(pcVar30);
    iVar21 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_3a8,psVar16);
    if (((iVar21._M_node != (_Base_ptr)(local_3a8 + 8)) &&
        (iVar21._M_node[2]._M_parent == (_Base_ptr)0xb)) &&
       (iVar14 = bcmp(*(void **)(iVar21._M_node + 2),"CXX_MODULES",0xb), iVar14 == 0)) {
      cmSourceFile::GetLanguage_abi_cxx11_((string *)local_348,pcVar30);
      uVar12 = local_348._0_8_;
      bVar13 = true;
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3) {
        iVar14 = bcmp((void *)local_348._0_8_,"CXX",3);
        bVar13 = iVar14 != 0;
      }
      if ((undefined1 *)uVar12 != local_338) {
        operator_delete((void *)uVar12,local_338._0_8_ + 1);
      }
      if (bVar13) {
        pcVar3 = (pcVar23->super_cmCommonTargetGenerator).Makefile;
        psVar22 = cmTarget::GetName_abi_cxx11_(this_03);
        local_348._0_8_ = (pointer)0x8;
        local_348._8_8_ = (long)"\nTarget \"" + 1;
        local_338._0_8_ = 0;
        local_328._M_allocated_capacity = (size_type)(psVar22->_M_dataplus)._M_p;
        local_338._8_8_ = psVar22->_M_string_length;
        local_328._8_8_ = 0;
        local_318._M_p = (pointer)0x18;
        local_310 = "\" contains the source\n  ";
        local_308._M_allocated_capacity = 0;
        local_2f8 = (psVar16->_M_dataplus)._M_p;
        local_308._8_8_ = psVar16->_M_string_length;
        local_2f0._M_allocated_capacity = 0;
        local_2f0._8_8_ = (_Base_ptr)0x18;
        local_2e0._M_head_impl = (cmCustomCommand *)0x8dc8dd;
        local_2d8._M_p = (pointer)0x0;
        local_2c8._M_allocated_capacity = *(undefined8 *)(iVar21._M_node + 2);
        local_2d0 = iVar21._M_node[2]._M_parent;
        local_2c8._8_8_ = (pointer)0x0;
        local_2b8._M_p = (pointer)0x35;
        local_2b0 = (_Base_ptr)0x8dc8f6;
        local_2a8[0]._M_allocated_capacity = (_Base_ptr)0x0;
        views_00._M_len = 7;
        views_00._M_array = (iterator)local_348;
        cmCatViews((string *)local_1b0,views_00);
        cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_1b0);
        if ((string *)local_1b0._0_8_ != (string *)(local_1b0 + 0x10)) {
          operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
        }
      }
    }
    ppcVar9 = local_3c8.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    local_3c8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppcVar11;
  }
  local_3c8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppcVar9;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_378);
  if (local_3c8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3c8.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3c8.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c8.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_3a8);
  if ((_Base_ptr)
      local_1e8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
    operator_delete(local_1e8.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((void *)local_190._8_8_ != (void *)0x0) {
    operator_delete((void *)local_190._8_8_,auStack_180._8_8_ - local_190._8_8_);
  }
  if ((_Base_ptr)auStack_180._24_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)auStack_180._24_8_,local_158 - auStack_180._24_8_);
  }
  if ((_Base_ptr)
      local_1c8.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetBuildRules()
{
  this->GeneratorTarget->CheckCxxModuleStatus(this->GetConfigName());

  // -- Write the custom commands for this target

  // Evaluates generator expressions and expands prop_value
  auto evaluatedFiles = [this](const std::string& prop_value) -> cmList {
    cmList files{ cmGeneratorExpression::Evaluate(
      prop_value, this->LocalGenerator, this->GetConfigName(),
      this->GeneratorTarget) };
    return files;
  };

  // Look for additional files registered for cleaning in this directory.
  if (cmValue prop_value =
        this->Makefile->GetProperty("ADDITIONAL_MAKE_CLEAN_FILES")) {
    auto const files = evaluatedFiles(*prop_value);
    this->CleanFiles.insert(files.begin(), files.end());
  }

  // Look for additional files registered for cleaning in this target.
  if (cmValue prop_value =
        this->GeneratorTarget->GetProperty("ADDITIONAL_CLEAN_FILES")) {
    auto const files = evaluatedFiles(*prop_value);
    // For relative path support
    std::string const& binaryDir =
      this->LocalGenerator->GetCurrentBinaryDirectory();
    for (std::string const& cfl : files) {
      this->CleanFiles.insert(cmSystemTools::CollapseFullPath(cfl, binaryDir));
    }
  }

  // Look for ISPC extra object files generated by this target
  auto const ispcAdditionalObjs =
    this->GeneratorTarget->GetGeneratedISPCObjects(this->GetConfigName());
  for (std::string const& ispcObj : ispcAdditionalObjs) {
    this->CleanFiles.insert(
      this->LocalGenerator->MaybeRelativeToCurBinDir(ispcObj));
  }

  // add custom commands to the clean rules?
  bool const clean = this->Makefile->GetProperty("CLEAN_NO_CUSTOM").IsOff();

  // First generate the object rule files.  Save a list of all object
  // files for this target.
  std::vector<cmSourceFile const*> customCommands;
  this->GeneratorTarget->GetCustomCommands(customCommands,
                                           this->GetConfigName());
  for (cmSourceFile const* sf : customCommands) {
    if (this->CMP0113New &&
        !this->LocalGenerator->GetCommandsVisited(this->GeneratorTarget)
           .insert(sf)
           .second) {
      continue;
    }
    cmCustomCommandGenerator ccg(*sf->GetCustomCommand(),
                                 this->GetConfigName(), this->LocalGenerator);
    this->GenerateCustomRuleFile(ccg);
    if (clean) {
      const std::vector<std::string>& outputs = ccg.GetOutputs();
      for (std::string const& output : outputs) {
        this->CleanFiles.insert(
          this->LocalGenerator->MaybeRelativeToCurBinDir(output));
      }
      const std::vector<std::string>& byproducts = ccg.GetByproducts();
      for (std::string const& byproduct : byproducts) {
        this->CleanFiles.insert(
          this->LocalGenerator->MaybeRelativeToCurBinDir(byproduct));
      }
    }
  }

  // Add byproducts from build events to the clean rules
  if (clean) {
    std::vector<cmCustomCommand> buildEventCommands =
      this->GeneratorTarget->GetPreBuildCommands();

    cm::append(buildEventCommands,
               this->GeneratorTarget->GetPreLinkCommands());
    cm::append(buildEventCommands,
               this->GeneratorTarget->GetPostBuildCommands());

    for (const auto& be : buildEventCommands) {
      cmCustomCommandGenerator beg(be, this->GetConfigName(),
                                   this->LocalGenerator);
      const std::vector<std::string>& byproducts = beg.GetByproducts();
      for (std::string const& byproduct : byproducts) {
        this->CleanFiles.insert(
          this->LocalGenerator->MaybeRelativeToCurBinDir(byproduct));
      }
    }
  }
  std::vector<cmSourceFile const*> headerSources;
  this->GeneratorTarget->GetHeaderSources(headerSources,
                                          this->GetConfigName());
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    headerSources, this->MacOSXContentGenerator.get(), this->GetConfigName());
  std::vector<cmSourceFile const*> extraSources;
  this->GeneratorTarget->GetExtraSources(extraSources, this->GetConfigName());
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    extraSources, this->MacOSXContentGenerator.get(), this->GetConfigName());
  cmValue pchExtension = this->Makefile->GetDefinition("CMAKE_PCH_EXTENSION");
  std::vector<cmSourceFile const*> externalObjects;
  this->GeneratorTarget->GetExternalObjects(externalObjects,
                                            this->GetConfigName());
  for (cmSourceFile const* sf : externalObjects) {
    auto const& objectFileName = sf->GetFullPath();
    if (!cmHasSuffix(objectFileName, pchExtension)) {
      this->ExternalObjects.push_back(objectFileName);
    }
  }

  std::map<std::string, std::string> file_set_map;

  auto const* tgt = this->GeneratorTarget->Target;
  for (auto const& name : tgt->GetAllFileSetNames()) {
    auto const* file_set = tgt->GetFileSet(name);
    if (!file_set) {
      this->Makefile->IssueMessage(
        MessageType::INTERNAL_ERROR,
        cmStrCat("Target \"", tgt->GetName(),
                 "\" is tracked to have file set \"", name,
                 "\", but it was not found."));
      continue;
    }

    auto fileEntries = file_set->CompileFileEntries();
    auto directoryEntries = file_set->CompileDirectoryEntries();
    auto directories = file_set->EvaluateDirectoryEntries(
      directoryEntries, this->LocalGenerator, this->GetConfigName(),
      this->GeneratorTarget);

    std::map<std::string, std::vector<std::string>> files;
    for (auto const& entry : fileEntries) {
      file_set->EvaluateFileEntry(directories, files, entry,
                                  this->LocalGenerator, this->GetConfigName(),
                                  this->GeneratorTarget);
    }

    for (auto const& it : files) {
      for (auto const& filename : it.second) {
        file_set_map[filename] = file_set->GetType();
      }
    }
  }

  std::vector<cmSourceFile const*> objectSources;
  this->GeneratorTarget->GetObjectSources(objectSources,
                                          this->GetConfigName());

  // validate that all languages requested are enabled.
  std::set<std::string> requiredLangs;
  if (this->HaveRequiredLanguages(objectSources, requiredLangs)) {
    for (cmSourceFile const* sf : objectSources) {
      // Generate this object file's rule file.
      this->WriteObjectRuleFiles(*sf);
    }
  }

  for (cmSourceFile const* sf : objectSources) {
    auto const& path = sf->GetFullPath();
    auto const it = file_set_map.find(path);
    if (it != file_set_map.end()) {
      auto const& file_set_type = it->second;
      if (file_set_type == "CXX_MODULES"_s) {
        if (sf->GetLanguage() != "CXX"_s) {
          this->Makefile->IssueMessage(
            MessageType::FATAL_ERROR,
            cmStrCat(
              "Target \"", tgt->GetName(), "\" contains the source\n  ", path,
              "\nin a file set of type \"", file_set_type,
              R"(" but the source is not classified as a "CXX" source.)"));
        }
      }
    }
  }
}